

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::JoinHashTable::ScanStructure::AdvancePointers
          (ScanStructure *this,SelectionVector *sel,idx_t sel_count)

{
  data_ptr_t pdVar1;
  long lVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  if ((this->ht->chains_longer_than_one == true) && (sel_count != 0)) {
    pdVar1 = (this->pointers).data;
    iVar3 = 0;
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)sel->sel_vector[iVar4];
      }
      lVar2 = *(long *)(*(long *)(pdVar1 + iVar5 * 8) + this->ht->pointer_offset);
      *(long *)(pdVar1 + iVar5 * 8) = lVar2;
      if (lVar2 != 0) {
        (this->sel_vector).sel_vector[iVar3] = (sel_t)iVar5;
        iVar3 = iVar3 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (sel_count != iVar4);
  }
  else {
    iVar3 = 0;
  }
  this->count = iVar3;
  return;
}

Assistant:

void ScanStructure::AdvancePointers(const SelectionVector &sel, const idx_t sel_count) {

	if (!ht.chains_longer_than_one) {
		this->count = 0;
		return;
	}

	// now for all the pointers, we move on to the next set of pointers
	idx_t new_count = 0;
	auto ptrs = FlatVector::GetData<data_ptr_t>(this->pointers);
	for (idx_t i = 0; i < sel_count; i++) {
		auto idx = sel.get_index(i);
		ptrs[idx] = LoadPointer(ptrs[idx] + ht.pointer_offset);
		if (ptrs[idx]) {
			this->sel_vector.set_index(new_count++, idx);
		}
	}
	this->count = new_count;
}